

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chameleon-core.cpp
# Opt level: O0

double * read2d(char *charfilename,char *charplane)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  mapped_type *pmVar8;
  long lVar9;
  ulong uVar10;
  long *plVar11;
  ostream *poVar12;
  char *in_RSI;
  char *in_RDI;
  long j_2;
  long i_3;
  long j_1;
  long i_2;
  long j;
  long i_1;
  double *b;
  long i;
  fstream fs;
  double *a;
  long n;
  long nz;
  long ny;
  long nx;
  string plane;
  string filename;
  char *in_stack_fffffffffffffb18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  key_type *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  double *local_388;
  allocator local_379;
  string local_378 [32];
  long local_358;
  allocator local_349;
  string local_348 [32];
  long local_328 [66];
  void *local_118;
  ulong local_110;
  allocator local_101;
  string local_100 [32];
  long local_e0;
  allocator local_d1;
  string local_d0 [32];
  long local_b0;
  allocator local_a1;
  string local_a0 [32];
  long local_80;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  char *local_18;
  double *local_8;
  
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RDI,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,local_18,&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"nx",&local_a1);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                         *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                        in_stack_fffffffffffffb58);
  dVar1 = *pmVar8;
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = (long)dVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"ny",&local_d1);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                         *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                        in_stack_fffffffffffffb58);
  dVar1 = *pmVar8;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_b0 = (long)dVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"nz",&local_101);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                         *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                        in_stack_fffffffffffffb58);
  lVar9 = (long)*pmVar8;
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  local_110 = local_80 * (local_b0 + lVar9) + local_b0 * lVar9;
  local_e0 = lVar9;
  std::fstream::fstream(local_328,local_38,_S_in);
  bVar7 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_328 + *(long *)(local_328[0] + -0x18)));
  if (bVar7) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_348,"output_mode",&local_349);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                           *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                          in_stack_fffffffffffffb58);
    dVar1 = *pmVar8;
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_378,"output_mode",&local_379);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                             *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                            in_stack_fffffffffffffb58);
      dVar1 = *pmVar8;
      std::__cxx11::string::~string(local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
      if ((dVar1 != 1.0) || (NAN(dVar1))) {
        poVar12 = std::operator<<((ostream *)&std::cerr,
                                  "libchameleon: read:: ERROR: unknown output_mode");
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        local_8 = (double *)0x0;
        goto LAB_00109ec8;
      }
      std::fstream::close();
      std::operator|(_S_in,_S_bin);
      std::fstream::open((string *)local_328,(_Ios_Openmode)local_38);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_110;
      uVar10 = SUB168(auVar3 * ZEXT816(8),0);
      if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      local_118 = operator_new__(uVar10);
      std::istream::read((char *)local_328,(long)local_118);
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_110;
      uVar10 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      local_118 = operator_new__(uVar10);
      local_358 = 0;
      while( true ) {
        plVar11 = (long *)std::istream::operator>>
                                    ((istream *)local_328,
                                     (double *)((long)local_118 + local_358 * 8));
        bVar7 = std::ios::operator_cast_to_bool
                          ((ios *)((long)plVar11 + *(long *)(*plVar11 + -0x18)));
        if (!bVar7 || (long)local_110 <= local_358) break;
        local_358 = local_358 + 1;
      }
    }
    std::fstream::close();
    bVar7 = std::operator==(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    if (bVar7) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_80 * local_b0;
      uVar10 = SUB168(auVar4 * ZEXT816(8),0);
      if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      local_388 = (double *)operator_new__(uVar10);
      for (local_390 = 0; local_390 < local_80; local_390 = local_390 + 1) {
        for (local_398 = 0; local_398 < local_b0; local_398 = local_398 + 1) {
          local_388[local_390 * local_b0 + local_398] =
               *(double *)((long)local_118 + (local_390 * (local_b0 + local_e0) + local_398) * 8);
        }
      }
    }
    else {
      bVar7 = std::operator==(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
      if (bVar7) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_80 * local_e0;
        uVar10 = SUB168(auVar5 * ZEXT816(8),0);
        if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        local_388 = (double *)operator_new__(uVar10);
        for (local_3a0 = 0; local_3a0 < local_80; local_3a0 = local_3a0 + 1) {
          for (local_3a8 = 0; local_3a8 < local_e0; local_3a8 = local_3a8 + 1) {
            local_388[local_3a0 * local_e0 + local_3a8] =
                 *(double *)
                  ((long)local_118 + (local_3a0 * (local_b0 + local_e0) + local_b0 + local_3a8) * 8)
            ;
          }
        }
      }
      else {
        bVar7 = std::operator==(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        if (!bVar7) {
          poVar12 = std::operator<<((ostream *)&std::cerr,
                                    "libchameleon: read: possible plane values are xy, xz and yz,given: "
                                   );
          poVar12 = std::operator<<(poVar12,local_70);
          std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
          if (local_118 != (void *)0x0) {
            operator_delete__(local_118);
          }
          local_8 = (double *)0x0;
          goto LAB_00109ec8;
        }
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_b0 * local_e0;
        uVar10 = SUB168(auVar6 * ZEXT816(8),0);
        if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        local_388 = (double *)operator_new__(uVar10);
        for (local_3b0 = 0; local_3b0 < local_b0; local_3b0 = local_3b0 + 1) {
          for (local_3b8 = 0; local_3b8 < local_e0; local_3b8 = local_3b8 + 1) {
            local_388[local_3b0 * local_e0 + local_3b8] =
                 *(double *)
                  ((long)local_118 +
                  (local_80 * (local_b0 + local_e0) + local_3b0 * local_e0 + local_3b8) * 8);
          }
        }
      }
    }
    if (local_118 != (void *)0x0) {
      operator_delete__(local_118);
    }
    local_8 = local_388;
  }
  else {
    poVar12 = std::operator<<((ostream *)&std::cerr,"libchameleon: read: ERROR: no such file, ");
    poVar12 = std::operator<<(poVar12,local_38);
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    local_8 = (double *)0x0;
  }
LAB_00109ec8:
  std::fstream::~fstream(local_328);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return local_8;
}

Assistant:

double* read2d(const char* charfilename, const char* charplane) {
    string filename(charfilename);
    string plane(charplane);
    long nx = conf["nx"];
    long ny = conf["ny"];
    long nz = conf["nz"];
    long n = nx * (ny + nz) + ny * nz;
    double* a;
    fstream fs(filename, ios_base::in);
    if (fs) {
        if (conf["output_mode"] == 0) {
            // text mode
            a = new double[n];
            long i = 0;
            while (fs >> a[i] && i < n)
                ++i;
        } else if (conf["output_mode"] == 1) {
            // binary mode
            fs.close();
            fs.open(filename, ios_base::in | ios_base::binary);
            a = new double[n];
            fs.read(reinterpret_cast<char*>(a), sizeof(double) * n);
        } else {
            cerr << "libchameleon: read:: ERROR: unknown output_mode" << endl;
            return nullptr;
        }
    } else {
        cerr << "libchameleon: read: ERROR: no such file, " << filename <<
            endl;
        return nullptr;
    }
    fs.close();
    double* b;
    if (plane == "xy") {
        b = new double[nx * ny];
        for (long i = 0; i < nx; ++i)
            for (long j = 0; j < ny; ++j)
                b[i * ny + j] = a[i * (ny + nz) + j];
    } else if (plane == "xz") {
        b = new double[nx * nz];
        for (long i = 0; i < nx; ++i)
            for (long j = 0; j < nz; ++j)
                b[i * nz + j] = a[i * (ny + nz) + ny + j];
    } else if (plane == "yz") {
        b = new double[ny * nz];
        for (long i = 0; i < ny; ++i)
            for (long j = 0; j < nz; ++j)
                b[i * nz + j] = a[nx * (ny + nz) + i * nz + j];
    } else {
        cerr << "libchameleon: read: possible plane values are xy, xz and yz,"
            "given: " << plane << endl;
        delete[] a;
        return nullptr;
    }
    delete[] a;
    return b;
}